

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O0

void __thiscall WasmCGen::LoadStore(WasmCGen *this,PCSTR stack_type,PCSTR mem_type,bool loadOrStore)

{
  uint uVar1;
  undefined8 uVar2;
  char *buf;
  long lVar3;
  char acStack_298 [104];
  undefined8 uStack_230;
  undefined1 auStack_228 [8];
  string *local_220;
  PCSTR local_218;
  PCSTR local_210;
  PCSTR local_208;
  char *local_200;
  allocator<char> *local_1f8;
  string *local_1f0;
  PCSTR local_1e8;
  undefined1 local_1d9;
  char *local_1d8;
  WasmCGen *local_1d0;
  char local_1c8 [112];
  char local_158 [104];
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  PCSTR local_a8;
  PCSTR load [4];
  string local_70;
  char *local_50;
  PCSTR u;
  PCSTR effective_address;
  PCSTR result;
  PCSTR i;
  PCSTR offset;
  PCSTR pcStack_20;
  bool loadOrStore_local;
  PCSTR mem_type_local;
  PCSTR stack_type_local;
  WasmCGen *this_local;
  
  buf = auStack_228;
  uStack_230 = 0x1403ae;
  local_1d0 = this;
  offset._7_1_ = loadOrStore;
  pcStack_20 = mem_type;
  mem_type_local = stack_type;
  stack_type_local = (PCSTR)this;
  printf("/*%s*/\n","LoadStore");
  lVar3 = (local_1d0->super_w3SourceGen).temp + 1;
  (local_1d0->super_w3SourceGen).temp = lVar3;
  uStack_230 = 0x1403cd;
  i = WasmCGenTemp(local_158,lVar3);
  lVar3 = (local_1d0->super_w3SourceGen).temp + 1;
  (local_1d0->super_w3SourceGen).temp = lVar3;
  uStack_230 = 0x1403f3;
  result = WasmCGenTemp(local_1c8,lVar3);
  if ((offset._7_1_ & 1) == 0) {
    local_1d8 = (char *)0x0;
  }
  else {
    buf = acStack_298;
    lVar3 = (local_1d0->super_w3SourceGen).temp + 1;
    (local_1d0->super_w3SourceGen).temp = lVar3;
    local_1d8 = WasmCGenTemp(buf,lVar3);
  }
  effective_address = local_1d8;
  lVar3 = (local_1d0->super_w3SourceGen).temp + 1;
  (local_1d0->super_w3SourceGen).temp = lVar3;
  buf[-0x78] = '_';
  buf[-0x77] = '\x04';
  buf[-0x76] = '\x14';
  buf[-0x75] = '\0';
  buf[-0x74] = '\0';
  buf[-0x73] = '\0';
  buf[-0x72] = '\0';
  buf[-0x71] = '\0';
  u = WasmCGenTemp(buf + -0x70,lVar3);
  lVar3 = (local_1d0->super_w3SourceGen).temp + 1;
  (local_1d0->super_w3SourceGen).temp = lVar3;
  buf[-0xe8] = -0x79;
  buf[-0xe7] = '\x04';
  buf[-0xe6] = '\x14';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  local_50 = WasmCGenTemp(buf + -0xe0,lVar3);
  uVar1 = (((local_1d0->super_w3SourceGen).super_Wasm.instr)->super_w3DecodedInstructionZeroInit).
          field_0.field_6.offset;
  local_1d9 = 0;
  buf[-0xe8] = -0x4c;
  buf[-0xe7] = '\x04';
  buf[-0xe6] = '\x14';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("const long %s = %u;\n",i,(ulong)uVar1);
  local_1e8 = result;
  local_1f0 = &local_70;
  buf[-0xe8] = -0x2a;
  buf[-0xe7] = '\x04';
  buf[-0xe6] = '\x14';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  w3SourceGen::pop_abi_cxx11_(local_1f0,&local_1d0->super_w3SourceGen);
  buf[-0xe8] = -0x1e;
  buf[-0xe7] = '\x04';
  buf[-0xe6] = '\x14';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  uVar2 = std::__cxx11::string::c_str();
  buf[-0xe8] = -2;
  buf[-0xe7] = '\x04';
  buf[-0xe6] = '\x14';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("const long %s = %s;\n",local_1e8,uVar2);
  builtin_strncpy(buf + -0xe8,"\t\x05\x14",4);
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  std::__cxx11::string::~string((string *)&local_70);
  builtin_strncpy(buf + -0xe8,"\x1b\x05\x14",4);
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("long %s;\n",u);
  builtin_strncpy(buf + -0xe8,"1\x05\x14",4);
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("%s %s;\n",mem_type_local,effective_address);
  builtin_strncpy(buf + -0xe8,"C\x05\x14",4);
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("if (%s >= 0)\n{\n",result);
  builtin_strncpy(buf + -0xe8,"]\x05\x14",4);
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("  %s = %s + (uint32_t)%s;\n",u,i,result);
  builtin_strncpy(buf + -0xe8,"s\x05\x14",4);
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("  if (%s < %s) Overflow();",u,i);
  buf[-0xe8] = -0x7f;
  buf[-0xe7] = '\x05';
  buf[-0xe6] = '\x14';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("\n}\nelse\n{\n");
  buf[-0xe8] = -0x69;
  buf[-0xe7] = '\x05';
  buf[-0xe6] = '\x14';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("  const size_t %s = int_magnitude (%s);\n",local_50,result);
  buf[-0xe8] = -0x53;
  buf[-0xe7] = '\x05';
  buf[-0xe6] = '\x14';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("  if (%s > %s) Overflow();\n",local_50,i);
  buf[-0xe8] = -0x39;
  buf[-0xe7] = '\x05';
  buf[-0xe6] = '\x14';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("  %s = %s - %s;",u,i,local_50);
  buf[-0xe8] = -0x2b;
  buf[-0xe7] = '\x05';
  buf[-0xe6] = '\x14';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("\n}\n");
  buf[-0xe8] = -0x15;
  buf[-0xe7] = '\x05';
  buf[-0xe6] = '\x14';
  buf[-0xe5] = '\0';
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  printf("if (%s > UINT_MAX - sizeof(%s)) Overflow();\n",u,pcStack_20);
  local_a8 = effective_address;
  load[0] = pcStack_20;
  load[1] = u;
  builtin_strncpy(buf + -0xe8,"#\x06\x14",4);
  buf[-0xe4] = '\0';
  buf[-0xe3] = '\0';
  buf[-0xe2] = '\0';
  buf[-0xe1] = '\0';
  local_208 = (PCSTR)std::__cxx11::string::c_str();
  load[2] = local_208;
  if ((offset._7_1_ & 1) == 0) {
    local_218 = load[0];
    local_210 = load[1];
    local_220 = &local_f0;
    builtin_strncpy(buf + -0xe8,"_\a\x14",4);
    buf[-0xe4] = '\0';
    buf[-0xe3] = '\0';
    buf[-0xe2] = '\0';
    buf[-0xe1] = '\0';
    w3SourceGen::pop_abi_cxx11_(local_220,&local_1d0->super_w3SourceGen);
    builtin_strncpy(buf + -0xe8,"k\a\x14",4);
    buf[-0xe4] = '\0';
    buf[-0xe3] = '\0';
    buf[-0xe2] = '\0';
    buf[-0xe1] = '\0';
    uVar2 = std::__cxx11::string::c_str();
    buf[-0xe8] = -0x6f;
    buf[-0xe7] = '\a';
    buf[-0xe6] = '\x14';
    buf[-0xe5] = '\0';
    buf[-0xe4] = '\0';
    buf[-0xe3] = '\0';
    buf[-0xe2] = '\0';
    buf[-0xe1] = '\0';
    printf("*(%s*)(%s + (PCH)%s_mem = %s;\n",local_218,local_210,local_208,uVar2);
    buf[-0xe8] = -0x61;
    buf[-0xe7] = '\a';
    buf[-0xe6] = '\x14';
    buf[-0xe5] = '\0';
    buf[-0xe4] = '\0';
    buf[-0xe3] = '\0';
    buf[-0xe2] = '\0';
    buf[-0xe1] = '\0';
    std::__cxx11::string::~string((string *)&local_f0);
  }
  else {
    builtin_strncpy(buf + -0xe8,"^\x06\x14",4);
    buf[-0xe4] = '\0';
    buf[-0xe3] = '\0';
    buf[-0xe2] = '\0';
    buf[-0xe1] = '\0';
    printf("%s = *(%s*)(%s + (PCH)%s_mem;\n",local_a8,load[0],load[1],local_208);
    local_200 = effective_address;
    local_1f8 = &local_c9;
    builtin_strncpy(buf + -0xe8,"|\x06\x14",4);
    buf[-0xe4] = '\0';
    buf[-0xe3] = '\0';
    buf[-0xe2] = '\0';
    buf[-0xe1] = '\0';
    std::allocator<char>::allocator();
    buf[-0xe8] = -0x6a;
    buf[-0xe7] = '\x06';
    buf[-0xe6] = '\x14';
    buf[-0xe5] = '\0';
    buf[-0xe4] = '\0';
    buf[-0xe3] = '\0';
    buf[-0xe2] = '\0';
    buf[-0xe1] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,local_200,local_1f8);
    buf[-0xe8] = -0x55;
    buf[-0xe7] = '\x06';
    buf[-0xe6] = '\x14';
    buf[-0xe5] = '\0';
    buf[-0xe4] = '\0';
    buf[-0xe3] = '\0';
    buf[-0xe2] = '\0';
    buf[-0xe1] = '\0';
    w3SourceGen::push(&local_1d0->super_w3SourceGen,&local_c8);
    buf[-0xe8] = -0x47;
    buf[-0xe7] = '\x06';
    buf[-0xe6] = '\x14';
    buf[-0xe5] = '\0';
    buf[-0xe4] = '\0';
    buf[-0xe3] = '\0';
    buf[-0xe2] = '\0';
    buf[-0xe1] = '\0';
    std::__cxx11::string::~string((string *)&local_c8);
    buf[-0xe8] = -0x3b;
    buf[-0xe7] = '\x06';
    buf[-0xe6] = '\x14';
    buf[-0xe5] = '\0';
    buf[-0xe4] = '\0';
    buf[-0xe3] = '\0';
    buf[-0xe2] = '\0';
    buf[-0xe1] = '\0';
    std::allocator<char>::~allocator(&local_c9);
  }
  return;
}

Assistant:

void WasmCGen::LoadStore (PCSTR stack_type, PCSTR mem_type, bool loadOrStore)
{
    printf ("/*%s*/\n", __func__);
    PCSTR offset = TEMP();
    PCSTR i = TEMP();
    PCSTR result = loadOrStore ? TEMP() : 0;
    PCSTR effective_address = TEMP();
    PCSTR u = TEMP();

    printf ("const long %s = %u;\n", offset, instr->offset);
    printf ("const long %s = %s;\n", i, pop().c_str());
    printf ("long %s;\n", effective_address);
    printf ("%s %s;\n", stack_type, result);

    printf ("if (%s >= 0)\n{\n", i);
    printf ("  %s = %s + (uint32_t)%s;\n", effective_address, offset, i);
    printf ("  if (%s < %s) Overflow();", effective_address, offset);
    printf ("\n}\nelse\n{\n");
    printf ("  const size_t %s = int_magnitude (%s);\n", u, i);
    printf ("  if (%s > %s) Overflow();\n", u, offset);
    printf ("  %s = %s - %s;", effective_address, offset, u);
    printf ("\n}\n");

    printf ("if (%s > UINT_MAX - sizeof(%s)) Overflow();\n", effective_address, mem_type);

    PCSTR load[4] = {result, mem_type, effective_address, module->name.c_str()};

    if (loadOrStore)
    {
        printf ("%s = *(%s*)(%s + (PCH)%s_mem;\n", load[0], load[1], load[2], load[3]);
        push(result);
    }
    else
    {
        printf ("*(%s*)(%s + (PCH)%s_mem = %s;\n", load[1], load[2], load[3], pop().c_str());
    }
}